

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.cpp
# Opt level: O1

void __thiscall
Js::SerializationCloner<Js::StreamWriter>::Write
          (SerializationCloner<Js::StreamWriter> *this,char16 *str,charcount_t len)

{
  undefined8 in_RAX;
  ulong uVar1;
  undefined8 local_28;
  uint32 byteLen;
  uint32 padding;
  
  local_28 = CONCAT44((int)((ulong)in_RAX >> 0x20),len * 2);
  StreamWriter::Write<unsigned_int>(this->m_writer,(uint *)&local_28);
  StreamWriter::Write(this->m_writer,str,local_28 & 0xffffffff);
  uVar1 = local_28 & 3;
  if ((local_28 & 3) != 0) {
    local_28 = local_28 & 0xffffffff;
    StreamWriter::Write(this->m_writer,(void *)((long)&local_28 + 4),4 - uVar1);
  }
  return;
}

Assistant:

void SerializationCloner<Writer>::Write(const char16* str, charcount_t len) const
    {
        uint32 byteLen = static_cast<uint32>(sizeof(char16) * len);
        m_writer->Write(byteLen);
        m_writer->Write(str, byteLen);
        uint32 unalignedLen = byteLen % sizeof(uint32);
        if (unalignedLen)
        {
            uint32 padding = 0;
            m_writer->Write(&padding, sizeof(uint32) - unalignedLen);
        }
    }